

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::DelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  Type *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  SourceLocation SVar5;
  Diagnostic *diag;
  InvalidTimingControl *pIVar6;
  char *func;
  SourceRange local_30;
  Expression *args;
  
  pEVar1 = (syntax->delayValue).ptr;
  if (pEVar1 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
  else {
    iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,0);
    args = (Expression *)CONCAT44(extraout_var,iVar4);
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    SVar5 = (SourceLocation)
            BumpAllocator::
            emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange>
                      (&compilation->super_BumpAllocator,args,&local_30);
    bVar3 = Expression::bad(args);
    if (bVar3) {
LAB_00285d6d:
      local_30.startLoc = SVar5;
      pIVar6 = BumpAllocator::
               emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                         (&compilation->super_BumpAllocator,(TimingControl **)&local_30);
      return &pIVar6->super_TimingControl;
    }
    pTVar2 = (args->type).ptr;
    if (pTVar2 != (Type *)0x0) {
      bVar3 = Type::isNumeric(pTVar2);
      if (bVar3) {
        return (TimingControl *)SVar5;
      }
      diag = ASTContext::addDiag(context,(DiagCode)0x100008,args->sourceRange);
      pTVar2 = (args->type).ptr;
      if (pTVar2 != (Type *)0x0) {
        ast::operator<<(diag,pTVar2);
        goto LAB_00285d6d;
      }
    }
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

TimingControl& DelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                        const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<DelayControl>(expr, syntax.sourceRange());
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}